

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool __thiscall cmDependsFortran::FindModule(cmDependsFortran *this,string *name,string *module)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pbVar2;
  string *ip;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string fullName;
  undefined1 local_68 [8];
  string mod_lower;
  string mod_upper;
  string *module_local;
  string *name_local;
  cmDependsFortran *this_local;
  
  std::__cxx11::string::string((string *)(mod_lower.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_68);
  cmFortranModuleAppendUpperLower
            (name,(string *)(mod_lower.field_2._M_local_buf + 8),(string *)local_68);
  std::__cxx11::string::string((string *)&__range1);
  this_00 = &(this->super_cmDepends).IncludePath;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  ip = (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&ip);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_00578a36:
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)local_68);
      std::__cxx11::string::~string((string *)(mod_lower.field_2._M_local_buf + 8));
      return this_local._7_1_;
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::operator=((string *)&__range1,(string *)pbVar2);
    std::__cxx11::string::operator+=((string *)&__range1,"/");
    std::__cxx11::string::operator+=((string *)&__range1,(string *)local_68);
    bVar1 = cmsys::SystemTools::FileExists((string *)&__range1,true);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)module,(string *)&__range1);
      this_local._7_1_ = true;
      goto LAB_00578a36;
    }
    std::__cxx11::string::operator=((string *)&__range1,(string *)pbVar2);
    std::__cxx11::string::operator+=((string *)&__range1,"/");
    std::__cxx11::string::operator+=
              ((string *)&__range1,(string *)(mod_lower.field_2._M_local_buf + 8));
    bVar1 = cmsys::SystemTools::FileExists((string *)&__range1,true);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)module,(string *)&__range1);
      this_local._7_1_ = true;
      goto LAB_00578a36;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmDependsFortran::FindModule(std::string const& name, std::string& module)
{
  // Construct possible names for the module file.
  std::string mod_upper;
  std::string mod_lower;
  cmFortranModuleAppendUpperLower(name, mod_upper, mod_lower);

  // Search the include path for the module.
  std::string fullName;
  for (std::string const& ip : this->IncludePath) {
    // Try the lower-case name.
    fullName = ip;
    fullName += "/";
    fullName += mod_lower;
    if (cmSystemTools::FileExists(fullName, true)) {
      module = fullName;
      return true;
    }

    // Try the upper-case name.
    fullName = ip;
    fullName += "/";
    fullName += mod_upper;
    if (cmSystemTools::FileExists(fullName, true)) {
      module = fullName;
      return true;
    }
  }
  return false;
}